

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O0

Am_Object Am_Create_Search_Dialog_For(Am_Object *main_undo_handler)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  Am_Value_List *list;
  Am_Method_Wrapper *value;
  Am_Object *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object *in_RSI;
  Am_Object local_1a8;
  Am_Value_List local_1a0;
  Am_Value_List local_190;
  Am_Value_List local_180;
  int current_y;
  Am_Object group;
  Am_Am_Slot_Key local_15a;
  Am_Value local_158;
  Am_Assoc local_148;
  undefined1 local_140 [8];
  Am_Value_List slots_to_item;
  undefined1 local_128 [8];
  Am_Value_List color_slots;
  Am_Value a;
  Am_Value_List pos_slots;
  Am_Object local_e8;
  Am_Value local_e0;
  Am_Assoc local_d0;
  Am_Value local_c8;
  Am_Value_List local_b8;
  Am_Am_Slot_Key local_a2;
  undefined1 local_a0 [6];
  Am_Am_Slot_Key this_slot;
  undefined1 local_90 [8];
  Am_Value v;
  Am_Value_List slots_values;
  Am_Value_List all_types;
  Am_Value_List local_all_slots;
  Am_Assoc as;
  Am_Object proto;
  undefined1 local_30 [8];
  Am_Value_List all_slots;
  Am_Object *main_undo_handler_local;
  Am_Object *this_search_window;
  
  all_slots.item._7_1_ = 0;
  Am_Object::Create(main_undo_handler,(char *)&Am_Search_Window);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30);
  Am_Object::Am_Object((Am_Object *)&as);
  Am_Assoc::Am_Assoc((Am_Assoc *)&local_all_slots.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&all_types.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&slots_values.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&v.value);
  Am_Value::Am_Value((Am_Value *)local_90);
  Am_Value_List::Start(&am_all_proto_names);
  while (bVar1 = Am_Value_List::Last(&am_all_proto_names), ((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar3 = Am_Value_List::Get(&am_all_proto_names);
    Am_Assoc::operator=((Am_Assoc *)&local_all_slots.item,pAVar3);
    Am_Assoc::Value_2((Am_Assoc *)local_a0);
    Am_Object::operator=((Am_Object *)&as,(Am_Value *)local_a0);
    Am_Value::~Am_Value((Am_Value *)local_a0);
    pAVar3 = Am_Object::Get((Am_Object *)&as,0xb8,0);
    Am_Value_List::operator=((Am_Value_List *)&all_types.item,pAVar3);
    list = Am_Value_List::Append_New
                     ((Am_Value_List *)local_30,(Am_Value_List *)&all_types.item,true);
    Am_Value_List::operator=((Am_Value_List *)local_30,list);
    Am_Value_List::Start((Am_Value_List *)&all_types.item);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&all_types.item), ((bVar1 ^ 0xffU) & 1) != 0
          ) {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)&all_types.item);
      Am_Am_Slot_Key::Am_Am_Slot_Key(&local_a2,pAVar3);
      Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_c8);
      Am_Value_List::Assoc_2(&local_b8,(Am_Value *)&v.value);
      bVar1 = Am_Value::Exists((Am_Value *)&local_b8);
      Am_Value::~Am_Value((Am_Value *)&local_b8);
      Am_Value::~Am_Value(&local_c8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        AVar2 = Am_Am_Slot_Key::operator_cast_to_unsigned_short(&local_a2);
        pAVar3 = Am_Object::Get((Am_Object *)&as,AVar2,1);
        Am_Value::operator=((Am_Value *)local_90,pAVar3);
        bVar1 = Am_Value::Exists((Am_Value *)local_90);
        if (!bVar1) {
          Am_Value::operator=((Am_Value *)local_90,0);
        }
        Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_e0);
        Am_Assoc::Am_Assoc(&local_d0,&local_e0,(Am_Value *)local_90);
        pAVar5 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_d0);
        Am_Value_List::Add((Am_Value_List *)&v.value,pAVar5,Am_TAIL,true);
        Am_Assoc::~Am_Assoc(&local_d0);
        Am_Value::~Am_Value(&local_e0);
      }
      Am_Value_List::Next((Am_Value_List *)&all_types.item);
    }
    Am_Object::Create(&local_e8,(char *)&Am_Command);
    value = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&new_item_value);
    pAVar4 = Am_Object::Set(&local_e8,0xca,value,0);
    Am_Assoc::Value_1((Am_Assoc *)&pos_slots.item);
    pAVar4 = Am_Object::Set(pAVar4,0x150,(Am_Value *)&pos_slots.item,0);
    pAVar4 = Am_Object::Set(pAVar4,0x154,-1,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&as);
    pAVar4 = Am_Object::Set(pAVar4,0x153,pAVar5,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar4);
    Am_Value_List::Add((Am_Value_List *)&slots_values.item,pAVar5,Am_TAIL,true);
    Am_Value::~Am_Value((Am_Value *)&pos_slots.item);
    Am_Object::~Am_Object(&local_e8);
    Am_Value_List::Next(&am_all_proto_names);
  }
  Am_Value_List::Am_Value_List((Am_Value_List *)&a.value);
  Am_Value::Am_Value((Am_Value *)&color_slots.item);
  am_check_list_slot(100,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x65,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x66,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x67,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x8b,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x8c,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x8d,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  am_check_list_slot(0x8e,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)&a.value);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_128);
  am_check_list_slot(0x6a,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)local_128);
  am_check_list_slot(0x6b,(Am_Value *)&color_slots.item,&Am_No_Object,(Am_Value_List *)local_30,
                     (Am_Value_List *)local_128);
  Am_Object::Get_Object
            ((Am_Object *)&slots_to_item.item,(Am_Slot_Key)main_undo_handler,(ulong)Am_TYPE_USE_ITEM
            );
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&slots_values.item);
  Am_Object::Set((Am_Object *)&slots_to_item.item,0xa2,pAVar5,0);
  Am_Object::~Am_Object((Am_Object *)&slots_to_item.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_140);
  Am_Am_Slot_Key::Am_Am_Slot_Key(&local_15a,0xb);
  Am_Am_Slot_Key::operator_cast_to_Am_Value((Am_Am_Slot_Key *)&local_158);
  Am_Object::Get_Object(&group,(Am_Slot_Key)main_undo_handler,(ulong)Am_TYPE_USE_ITEM);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&group);
  Am_Assoc::Am_Assoc(&local_148,&local_158,pAVar5);
  pAVar5 = Am_Assoc::operator_cast_to_Am_Wrapper_(&local_148);
  Am_Value_List::Add((Am_Value_List *)local_140,pAVar5,Am_TAIL,true);
  Am_Assoc::~Am_Assoc(&local_148);
  Am_Object::~Am_Object(&group);
  Am_Value::~Am_Value(&local_158);
  Am_Object::Am_Object((Am_Object *)&stack0xfffffffffffffe90);
  local_180.item._4_4_ = 0x88;
  bVar1 = Am_Value_List::Valid((Am_Value_List *)&a.value);
  if (bVar1) {
    generate_search_group
              (&local_180,&a.value.char_value,(int *)0x39103f,(bool)((char)&local_180 + '\f'),
               (Am_Value_List *)0x0,(Am_Value_List *)local_140);
    Am_Object::operator=((Am_Object *)&stack0xfffffffffffffe90,(Am_Object *)&local_180);
    Am_Object::~Am_Object((Am_Object *)&local_180);
    Am_Object::Am_Object((Am_Object *)&local_190.item,(Am_Object *)&stack0xfffffffffffffe90);
    Am_Object::Add_Part(main_undo_handler,(Am_Object *)&local_190.item,true,0);
    Am_Object::~Am_Object((Am_Object *)&local_190.item);
  }
  local_180.item._4_4_ = local_180.item._4_4_ + 5;
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_128);
  if (bVar1) {
    generate_search_group
              (&local_190,local_128,(int *)"Colors",(bool)((char)&local_180 + '\f'),
               (Am_Value_List *)0x0,(Am_Value_List *)local_140);
    Am_Object::operator=((Am_Object *)&stack0xfffffffffffffe90,(Am_Object *)&local_190);
    Am_Object::~Am_Object((Am_Object *)&local_190);
    Am_Object::Am_Object((Am_Object *)&local_1a0.item,(Am_Object *)&stack0xfffffffffffffe90);
    Am_Object::Add_Part(main_undo_handler,(Am_Object *)&local_1a0.item,true,0);
    Am_Object::~Am_Object((Am_Object *)&local_1a0.item);
  }
  local_180.item._4_4_ = local_180.item._4_4_ + 5;
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_30);
  if (bVar1) {
    generate_search_group
              (&local_1a0,local_30,(int *)"Other",(bool)((char)&local_180 + '\f'),
               (Am_Value_List *)0x0,(Am_Value_List *)local_140);
    Am_Object::operator=((Am_Object *)&stack0xfffffffffffffe90,(Am_Object *)&local_1a0);
    Am_Object::~Am_Object((Am_Object *)&local_1a0);
    Am_Object::Am_Object(&local_1a8,(Am_Object *)&stack0xfffffffffffffe90);
    Am_Object::Add_Part(main_undo_handler,&local_1a8,true,0);
    Am_Object::~Am_Object(&local_1a8);
  }
  local_180.item._4_4_ = local_180.item._4_4_ + 5;
  add_bottom_part(main_undo_handler,(int *)((long)&local_180.item + 4));
  Am_Object::Set(main_undo_handler,0x67,local_180.item._4_4_,0);
  AVar2 = Am_SLOTS_TO_ITEMS;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_140);
  Am_Object::Set(main_undo_handler,AVar2,pAVar5,0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(in_RSI);
  Am_Object::Set(main_undo_handler,0x174,pAVar5,0);
  bVar1 = Am_Object::Valid(in_RSI);
  AVar2 = Am_SEARCH_DIALOG;
  if (bVar1) {
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(main_undo_handler);
    Am_Object::Set(in_RSI,AVar2,pAVar5,1);
  }
  all_slots.item._7_1_ = 1;
  Am_Object::~Am_Object((Am_Object *)&stack0xfffffffffffffe90);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_140);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_128);
  Am_Value::~Am_Value((Am_Value *)&color_slots.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&a.value);
  Am_Value::~Am_Value((Am_Value *)local_90);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&v.value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&slots_values.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&all_types.item);
  Am_Assoc::~Am_Assoc((Am_Assoc *)&local_all_slots.item);
  Am_Object::~Am_Object((Am_Object *)&as);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  if ((all_slots.item._7_1_ & 1) == 0) {
    Am_Object::~Am_Object(main_undo_handler);
  }
  return (Am_Object)(Am_Object_Data *)main_undo_handler;
}

Assistant:

Am_Object
Am_Create_Search_Dialog_For(/* Am_Load_Save_Context& ls_context, */
                            Am_Object &main_undo_handler)
{
  Am_Object this_search_window = Am_Search_Window.Create();
  Am_Value_List all_slots;
  Am_Object proto;
  Am_Assoc as;
  Am_Value_List local_all_slots;
  Am_Value_List all_types;
  Am_Value_List slots_values;
  Am_Value v;
  for (am_all_proto_names.Start(); !am_all_proto_names.Last();
       am_all_proto_names.Next()) {
    as = am_all_proto_names.Get();
    proto = as.Value_2();
    local_all_slots = proto.Get(Am_SLOTS_TO_SAVE);
    all_slots = all_slots.Append_New(local_all_slots);
    for (local_all_slots.Start(); !local_all_slots.Last();
         local_all_slots.Next()) {
      Am_Am_Slot_Key this_slot = local_all_slots.Get();
      if (!(slots_values.Assoc_2(this_slot).Exists())) {
        v = proto.Get(this_slot, Am_OK_IF_NOT_THERE);
        if (!v.Exists())
          v = 0;
        slots_values.Add(Am_Assoc(this_slot, v));
      }
    }

    all_types.Add(Am_Command.Create()
                      .Set(Am_DO_METHOD, new_item_value)
                      .Set(Am_LABEL, as.Value_1())
                      .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                      .Set(Am_ID, proto));
  }
  Am_Value_List pos_slots;
  Am_Value a;
  am_check_list_slot(Am_LEFT, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_TOP, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_WIDTH, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_HEIGHT, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_X1, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_Y1, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_X2, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_Y2, a, Am_No_Object, all_slots, pos_slots);
  Am_Value_List color_slots;
  am_check_list_slot(Am_FILL_STYLE, a, Am_No_Object, all_slots, color_slots);
  am_check_list_slot(Am_LINE_STYLE, a, Am_No_Object, all_slots, color_slots);

  this_search_window.Get_Object(Am_TYPE_USE_ITEM).Set(Am_ITEMS, all_types);
  Am_Value_List slots_to_item;
  slots_to_item.Add(Am_Assoc(Am_Am_Slot_Key(Am_PROTOTYPE),
                             this_search_window.Get_Object(Am_TYPE_USE_ITEM)));

  Am_Object group;

  int current_y = 136;
  //  Generate the location section
  if (pos_slots.Valid()) {
    group = generate_search_group(pos_slots, "Location", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;

  //  Generate the color section
  if (color_slots.Valid()) {
    group = generate_search_group(color_slots, "Colors", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;

  //  Generate the "other" section
  if (all_slots.Valid()) {
    group = generate_search_group(all_slots, "Other", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;
  add_bottom_part(this_search_window, current_y);
  this_search_window.Set(Am_HEIGHT, current_y);
  this_search_window.Set(Am_SLOTS_TO_ITEMS, slots_to_item);
  this_search_window.Set(Am_UNDO_HANDLER, main_undo_handler);
  if (main_undo_handler.Valid())
    main_undo_handler.Set(Am_SEARCH_DIALOG, this_search_window,
                          Am_OK_IF_NOT_THERE);
  return this_search_window;
}